

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# date_part.cpp
# Opt level: O2

void duckdb::EpochMsFun::GetFunctions(void)

{
  scalar_function_t timetz_func;
  duckdb *in_RDI;
  initializer_list<duckdb::LogicalType> __l;
  initializer_list<duckdb::LogicalType> __l_00;
  ulong uVar1;
  function_statistics_t in_stack_fffffffffffffbf0;
  code *local_3e8 [2];
  code *local_3d8;
  code *local_3d0;
  code *local_3c8 [2];
  code *local_3b8;
  code *local_3b0;
  LogicalType local_3a8 [24];
  vector<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_> local_390;
  LogicalType local_378 [24];
  vector<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_> local_360;
  code *local_348 [2];
  code *local_338;
  code *local_330;
  LogicalType local_328 [24];
  LogicalType local_310 [24];
  LogicalType local_2f8 [24];
  code *local_2e0 [2];
  code *local_2d0;
  code *local_2c8;
  code *local_2c0 [2];
  code *local_2b0;
  code *local_2a8;
  code *local_2a0 [2];
  code *local_290;
  code *local_288;
  ScalarFunction local_280;
  ScalarFunction local_158;
  
  duckdb::LogicalType::LogicalType(local_2f8,BIGINT);
  local_348[1] = (code *)0x0;
  local_348[0] = DatePart::
                 UnaryFunction<duckdb::timestamp_t,long,duckdb::DatePart::EpochMillisOperator>;
  local_330 = std::
              _Function_handler<void_(duckdb::DataChunk_&,_duckdb::ExpressionState_&,_duckdb::Vector_&),_void_(*)(duckdb::DataChunk_&,_duckdb::ExpressionState_&,_duckdb::Vector_&)>
              ::_M_invoke;
  local_338 = std::
              _Function_handler<void_(duckdb::DataChunk_&,_duckdb::ExpressionState_&,_duckdb::Vector_&),_void_(*)(duckdb::DataChunk_&,_duckdb::ExpressionState_&,_duckdb::Vector_&)>
              ::_M_manager;
  local_2a0[1] = (code *)0x0;
  local_2a0[0] = ScalarFunction::
                 UnaryFunction<duckdb::interval_t,long,duckdb::DatePart::EpochMillisOperator>;
  local_288 = std::
              _Function_handler<void_(duckdb::DataChunk_&,_duckdb::ExpressionState_&,_duckdb::Vector_&),_void_(*)(duckdb::DataChunk_&,_duckdb::ExpressionState_&,_duckdb::Vector_&)>
              ::_M_invoke;
  local_290 = std::
              _Function_handler<void_(duckdb::DataChunk_&,_duckdb::ExpressionState_&,_duckdb::Vector_&),_void_(*)(duckdb::DataChunk_&,_duckdb::ExpressionState_&,_duckdb::Vector_&)>
              ::_M_manager;
  local_2c0[1] = (code *)0x0;
  local_2c0[0] = ScalarFunction::
                 UnaryFunction<duckdb::dtime_t,long,duckdb::DatePart::EpochMillisOperator>;
  local_2a8 = std::
              _Function_handler<void_(duckdb::DataChunk_&,_duckdb::ExpressionState_&,_duckdb::Vector_&),_void_(*)(duckdb::DataChunk_&,_duckdb::ExpressionState_&,_duckdb::Vector_&)>
              ::_M_invoke;
  local_2b0 = std::
              _Function_handler<void_(duckdb::DataChunk_&,_duckdb::ExpressionState_&,_duckdb::Vector_&),_void_(*)(duckdb::DataChunk_&,_duckdb::ExpressionState_&,_duckdb::Vector_&)>
              ::_M_manager;
  local_2e0[1] = (code *)0x0;
  local_2e0[0] = ScalarFunction::
                 UnaryFunction<duckdb::dtime_tz_t,long,duckdb::DatePart::EpochMillisOperator>;
  local_2c8 = std::
              _Function_handler<void_(duckdb::DataChunk_&,_duckdb::ExpressionState_&,_duckdb::Vector_&),_void_(*)(duckdb::DataChunk_&,_duckdb::ExpressionState_&,_duckdb::Vector_&)>
              ::_M_invoke;
  local_2d0 = std::
              _Function_handler<void_(duckdb::DataChunk_&,_duckdb::ExpressionState_&,_duckdb::Vector_&),_void_(*)(duckdb::DataChunk_&,_duckdb::ExpressionState_&,_duckdb::Vector_&)>
              ::_M_manager;
  uVar1 = 0;
  timetz_func.super__Function_base._M_functor._8_8_ =
       DatePart::EpochMillisOperator::PropagateStatistics<duckdb::date_t>;
  timetz_func.super__Function_base._M_functor._M_unused._M_object = local_2e0;
  timetz_func.super__Function_base._M_manager =
       DatePart::EpochMillisOperator::PropagateStatistics<duckdb::timestamp_t>;
  timetz_func._M_invoker._0_4_ = 0x6f42ea;
  timetz_func._M_invoker._4_4_ = 0;
  GetGenericTimePartFunction
            (in_RDI,local_2f8,(scalar_function_t *)&stack0xfffffffffffffbf8,
             (scalar_function_t *)local_348,(scalar_function_t *)local_2a0,
             (scalar_function_t *)local_2c0,timetz_func,
             DatePart::EpochMillisOperator::PropagateStatistics<duckdb::dtime_tz_t>,
             in_stack_fffffffffffffbf0,
             DatePart::UnaryFunction<duckdb::date_t,long,duckdb::DatePart::EpochMillisOperator>,
             (function_statistics_t)0x0);
  std::_Function_base::~_Function_base((_Function_base *)local_2e0);
  std::_Function_base::~_Function_base((_Function_base *)local_2c0);
  std::_Function_base::~_Function_base((_Function_base *)local_2a0);
  std::_Function_base::~_Function_base((_Function_base *)local_348);
  std::_Function_base::~_Function_base((_Function_base *)&stack0xfffffffffffffbf8);
  duckdb::LogicalType::~LogicalType(local_2f8);
  duckdb::LogicalType::LogicalType((LogicalType *)&stack0xfffffffffffffbf8,TIMESTAMP_TZ);
  __l._M_len = 1;
  __l._M_array = (iterator)&stack0xfffffffffffffbf8;
  std::vector<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_>::vector
            (&local_360,__l,(allocator_type *)local_348);
  duckdb::LogicalType::LogicalType(local_378,BIGINT);
  local_3c8[1] = (code *)0x0;
  local_3c8[0] = DatePart::
                 UnaryFunction<duckdb::timestamp_t,long,duckdb::DatePart::EpochMillisOperator>;
  local_3b0 = std::
              _Function_handler<void_(duckdb::DataChunk_&,_duckdb::ExpressionState_&,_duckdb::Vector_&),_void_(*)(duckdb::DataChunk_&,_duckdb::ExpressionState_&,_duckdb::Vector_&)>
              ::_M_invoke;
  local_3b8 = std::
              _Function_handler<void_(duckdb::DataChunk_&,_duckdb::ExpressionState_&,_duckdb::Vector_&),_void_(*)(duckdb::DataChunk_&,_duckdb::ExpressionState_&,_duckdb::Vector_&)>
              ::_M_manager;
  duckdb::LogicalType::LogicalType(local_310,INVALID);
  uVar1 = uVar1 & 0xffffffff00000000;
  duckdb::ScalarFunction::ScalarFunction
            (&local_158,&local_360,local_378,local_3c8,0,0,
             DatePart::EpochMillisOperator::PropagateStatistics<duckdb::timestamp_t>,0,local_310,0,
             uVar1,0);
  std::vector<duckdb::ScalarFunction,_std::allocator<duckdb::ScalarFunction>_>::
  emplace_back<duckdb::ScalarFunction>
            ((vector<duckdb::ScalarFunction,_std::allocator<duckdb::ScalarFunction>_> *)
             (in_RDI + 0x20),&local_158);
  ScalarFunction::~ScalarFunction(&local_158);
  duckdb::LogicalType::~LogicalType(local_310);
  std::_Function_base::~_Function_base((_Function_base *)local_3c8);
  duckdb::LogicalType::~LogicalType(local_378);
  std::vector<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_>::~vector(&local_360);
  duckdb::LogicalType::~LogicalType((LogicalType *)&stack0xfffffffffffffbf8);
  duckdb::LogicalType::LogicalType((LogicalType *)&stack0xfffffffffffffbf8,BIGINT);
  __l_00._M_len = 1;
  __l_00._M_array = (iterator)&stack0xfffffffffffffbf8;
  std::vector<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_>::vector
            (&local_390,__l_00,(allocator_type *)local_348);
  duckdb::LogicalType::LogicalType(local_3a8,TIMESTAMP);
  local_3e8[1] = (code *)0x0;
  local_3e8[0] = DatePart::EpochMillisOperator::Inverse;
  local_3d0 = std::
              _Function_handler<void_(duckdb::DataChunk_&,_duckdb::ExpressionState_&,_duckdb::Vector_&),_void_(*)(duckdb::DataChunk_&,_duckdb::ExpressionState_&,_duckdb::Vector_&)>
              ::_M_invoke;
  local_3d8 = std::
              _Function_handler<void_(duckdb::DataChunk_&,_duckdb::ExpressionState_&,_duckdb::Vector_&),_void_(*)(duckdb::DataChunk_&,_duckdb::ExpressionState_&,_duckdb::Vector_&)>
              ::_M_manager;
  duckdb::LogicalType::LogicalType(local_328,INVALID);
  duckdb::ScalarFunction::ScalarFunction
            (&local_280,&local_390,local_3a8,local_3e8,0,0,0,0,local_328,0,
             uVar1 & 0xffffffff00000000,0);
  std::vector<duckdb::ScalarFunction,_std::allocator<duckdb::ScalarFunction>_>::
  emplace_back<duckdb::ScalarFunction>
            ((vector<duckdb::ScalarFunction,_std::allocator<duckdb::ScalarFunction>_> *)
             (in_RDI + 0x20),&local_280);
  ScalarFunction::~ScalarFunction(&local_280);
  duckdb::LogicalType::~LogicalType(local_328);
  std::_Function_base::~_Function_base((_Function_base *)local_3e8);
  duckdb::LogicalType::~LogicalType(local_3a8);
  std::vector<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_>::~vector(&local_390);
  duckdb::LogicalType::~LogicalType((LogicalType *)&stack0xfffffffffffffbf8);
  return;
}

Assistant:

ScalarFunctionSet EpochMsFun::GetFunctions() {
	using OP = DatePart::EpochMillisOperator;
	auto operator_set = GetTimePartFunction<OP>();

	//	TIMESTAMP WITH TIME ZONE has the same representation as TIMESTAMP so no need to defer to ICU
	auto tstz_func = DatePart::UnaryFunction<timestamp_t, int64_t, OP>;
	auto tstz_stats = OP::template PropagateStatistics<timestamp_t>;
	operator_set.AddFunction(
	    ScalarFunction({LogicalType::TIMESTAMP_TZ}, LogicalType::BIGINT, tstz_func, nullptr, nullptr, tstz_stats));

	//	Legacy inverse BIGINT => TIMESTAMP
	operator_set.AddFunction(
	    ScalarFunction({LogicalType::BIGINT}, LogicalType::TIMESTAMP, DatePart::EpochMillisOperator::Inverse));

	return operator_set;
}